

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall number::positive_exponent_int::test_method(positive_exponent_int *this)

{
  JSONType JVar1;
  double result;
  undefined8 local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  JSONParser json;
  
  std::__cxx11::string::string((string *)&local_d0,"1e10",(allocator *)&result);
  json.p = (char *)local_d0;
  json.pe = (char *)((long)local_d0 + CONCAT71(uStack_c7,local_c8));
  json.skipOverErrors = false;
  json.eof = json.pe;
  std::__cxx11::string::~string((string *)&local_d0);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x55);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00112b78;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_78 = "";
  JVar1 = yajp::JSONParser::getNextType(&json,false);
  result = (double)CONCAT44(result._4_4_,JVar1);
  local_d8 = CONCAT44(local_d8._4_4_,0x30);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
            (&local_d0,&local_80,0x55,2,2,&result,"json.getNextType()",&local_d8,
             "yajp::JSONParser::number");
  result = yajp::JSONParser::readNumber<double>(&json);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x57);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00112b78;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_a8 = "";
  local_d8 = 10000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,long>
            (&local_d0,&local_b0,0x57,1,2,&result,"result",&local_d8,"10000000000");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( positive_exponent_int ) {
    yajp::JSONParser json("1e10");
    BOOST_REQUIRE_EQUAL(json.getNextType(), yajp::JSONParser::number);
    double result = json.readNumber();
    BOOST_CHECK_EQUAL(result, 10000000000);
}